

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O1

ILayer * __thiscall DenseLifLayer::ResetGrad(DenseLifLayer *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (this->super_ILayer).neurons.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->super_ILayer).neurons.
                 super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    (*(*ppIVar2)->_vptr_INeuron[10])();
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::ResetGrad()
{
    for ( auto neuron: neurons ) {
        neuron->ResetGrad();
    }
    return *this;
}